

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterTests.cpp
# Opt level: O3

void addShuffleAndSeed<CoreML::Specification::NeuralNetworkClassifier>
               (NeuralNetworkClassifier *nn,int64_t defaultValue,int64_t minValue,int64_t maxValue,
               set<long,_std::less<long>,_std::allocator<long>_> *allowedValues)

{
  long lVar1;
  NetworkUpdateParameters *this;
  BoolParameter *this_00;
  Int64Parameter *this_01;
  Int64Set *this_02;
  _Base_ptr p_Var2;
  Int64Range *this_03;
  _Rb_tree_header *p_Var3;
  int iVar4;
  int iVar5;
  
  this = nn->updateparams_;
  if (this == (NetworkUpdateParameters *)0x0) {
    this = (NetworkUpdateParameters *)operator_new(0x50);
    CoreML::Specification::NetworkUpdateParameters::NetworkUpdateParameters(this);
    nn->updateparams_ = this;
  }
  this_00 = this->shuffle_;
  if (this_00 == (BoolParameter *)0x0) {
    this_00 = (BoolParameter *)operator_new(0x18);
    CoreML::Specification::BoolParameter::BoolParameter(this_00);
    this->shuffle_ = this_00;
  }
  this_00->defaultvalue_ = true;
  this_01 = this->seed_;
  if (this_01 == (Int64Parameter *)0x0) {
    this_01 = (Int64Parameter *)operator_new(0x28);
    CoreML::Specification::Int64Parameter::Int64Parameter(this_01);
    this->seed_ = this_01;
  }
  this_01->defaultvalue_ = defaultValue;
  if ((allowedValues->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
    if (this_01->_oneof_case_[0] == 10) {
      this_03 = (this_01->AllowedValues_).range_;
    }
    else {
      CoreML::Specification::Int64Parameter::clear_AllowedValues(this_01);
      this_01->_oneof_case_[0] = 10;
      this_03 = (Int64Range *)operator_new(0x28);
      CoreML::Specification::Int64Range::Int64Range(this_03);
      (this_01->AllowedValues_).range_ = this_03;
    }
    this_03->minvalue_ = minValue;
    this_03->maxvalue_ = maxValue;
  }
  else {
    if (this_01->_oneof_case_[0] == 0xb) {
      this_02 = (this_01->AllowedValues_).set_;
    }
    else {
      CoreML::Specification::Int64Parameter::clear_AllowedValues(this_01);
      this_01->_oneof_case_[0] = 0xb;
      this_02 = (Int64Set *)operator_new(0x28);
      CoreML::Specification::Int64Set::Int64Set(this_02);
      (this_01->AllowedValues_).set_ = this_02;
    }
    p_Var2 = (allowedValues->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var3 = &(allowedValues->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var2 != p_Var3) {
      iVar4 = (this_02->values_).current_size_;
      do {
        lVar1 = *(long *)(p_Var2 + 1);
        iVar5 = iVar4;
        if (iVar4 == (this_02->values_).total_size_) {
          google::protobuf::RepeatedField<long>::Reserve(&this_02->values_,iVar4 + 1);
          iVar5 = (this_02->values_).current_size_;
        }
        iVar4 = iVar5 + 1;
        (this_02->values_).current_size_ = iVar4;
        ((this_02->values_).rep_)->elements[iVar5] = lVar1;
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
      } while ((_Rb_tree_header *)p_Var2 != p_Var3);
    }
  }
  return;
}

Assistant:

void addShuffleAndSeed(NeuralNetworkClass *nn, int64_t defaultValue, int64_t minValue,  int64_t maxValue, std::set<int64_t> allowedValues) {
    auto updateParameters = nn->mutable_updateparams();
    auto shuffle = updateParameters->mutable_shuffle();
    shuffle->set_defaultvalue(true);

    auto shuffleSeed = updateParameters->mutable_seed();
    shuffleSeed->set_defaultvalue(defaultValue);

    if (allowedValues.size() == 0) {
        auto int64Range = shuffleSeed->mutable_range();
        int64Range->set_minvalue(minValue);
        int64Range->set_maxvalue(maxValue);
    }
    else {
        auto int64Set = shuffleSeed->mutable_set();
        for (auto& x : allowedValues) {
            int64Set->add_values(x);
        }
    }
}